

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QString,_QMimeTypeXMLData>::emplaceValue<QMimeTypeXMLData>
          (Node<QString,_QMimeTypeXMLData> *this,QMimeTypeXMLData *args)

{
  long in_FS_OFFSET;
  QMimeTypeXMLData QStack_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeTypeXMLData::QMimeTypeXMLData(&QStack_88,args);
  QMimeTypeXMLData::operator=(&this->value,&QStack_88);
  QMimeTypeXMLData::~QMimeTypeXMLData(&QStack_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }